

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O3

void __thiscall teetime::Configuration::Configuration(Configuration *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Configuration = (_func_int **)&PTR__Configuration_00149a98;
  (this->m_connections).
  super__Vector_base<teetime::Configuration::connection,_std::allocator<teetime::Configuration::connection>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_connections).
  super__Vector_base<teetime::Configuration::connection,_std::allocator<teetime::Configuration::connection>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_connections).
  super__Vector_base<teetime::Configuration::connection,_std::allocator<teetime::Configuration::connection>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->m_stages)._M_t._M_impl.super__Rb_tree_header;
  (this->m_stages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_stages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_stages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_stages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_stages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_stageSettings)._M_t._M_impl.super__Rb_tree_header;
  (this->m_stageSettings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_stageSettings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_stageSettings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_stageSettings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_stageSettings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Configuration::Configuration()
{
}